

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scenario.cpp
# Opt level: O2

void __thiscall
multi_agent_planning::Scenario::Scenario
          (Scenario *this,
          vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
          *actions,vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                   *graphs,int numInteractions)

{
  vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  *this_00;
  int max;
  pointer pvVar1;
  pointer peVar2;
  pointer ppVar3;
  int *piVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  iterator iVar11;
  mapped_type *this_01;
  int iVar12;
  ulong uVar13;
  pointer peVar14;
  value_type local_118;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  generated;
  undefined4 uStack_a0;
  undefined4 local_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  int iStack_84;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  Graph g;
  
  std::
  vector<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>,_std::allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>_>
  ::vector(&this->interactionMaps,
           ((long)(actions->
                  super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(actions->
                 super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&local_118);
  this_00 = &this->allActions;
  (this->allActions).
  super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->allActions).
  super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->allActions).
  super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar13 = 0;
      pvVar1 = (actions->
               super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar13 < (ulong)(((long)(actions->
                              super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18);
      uVar13 = uVar13 + 1) {
    peVar2 = *(pointer *)
              ((long)&pvVar1[uVar13].
                      super__Vector_base<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    for (peVar14 = pvVar1[uVar13].
                   super__Vector_base<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; peVar14 != peVar2;
        peVar14 = peVar14 + 1) {
      local_118.agentA = (int)uVar13;
      local_118.actionA.m_eproperty = peVar14->m_eproperty;
      uVar5 = (peVar14->super_edge_base<boost::directed_tag,_unsigned_long>).m_source;
      uVar6 = (peVar14->super_edge_base<boost::directed_tag,_unsigned_long>).m_target;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ =
           (undefined4)uVar5;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ =
           (undefined4)(uVar5 >> 0x20);
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ =
           (undefined4)uVar6;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ =
           (undefined4)(uVar6 >> 0x20);
      std::
      vector<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>,std::allocator<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>
      ::
      emplace_back<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>
                ((vector<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>,std::allocator<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>
                  *)this_00,
                 (pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_> *)
                 &local_118);
    }
  }
  generated._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &generated._M_t._M_impl.super__Rb_tree_header._M_header;
  generated._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  generated._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  generated._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar12 = 0;
  generated._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       generated._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (numInteractions < 1) {
    numInteractions = 0;
  }
  for (; iVar12 != numInteractions; iVar12 = iVar12 + 1) {
    do {
      do {
        iVar8 = getRndInt((int)((ulong)((long)(this->allActions).
                                              super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->allActions).
                                             super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1);
        iVar9 = getRndInt((int)((ulong)((long)(this->allActions).
                                              super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->allActions).
                                             super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1);
        ppVar3 = (this_00->
                 super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (ppVar3[iVar8].first == ppVar3[iVar9].first);
      local_118.agentA = iVar8;
      local_118._4_4_ = iVar9;
      iVar11 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               ::find(&generated._M_t,(key_type *)&local_118);
    } while ((_Rb_tree_header *)iVar11._M_node != &generated._M_t._M_impl.super__Rb_tree_header);
    local_118.agentA = iVar8;
    local_118._4_4_ = iVar9;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
    ::_M_insert_unique<std::pair<int,int>>
              ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                *)&generated,(pair<int,_int> *)&local_118);
    ppVar3 = (this_00->
             super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (int *)ppVar3[iVar9].second.m_eproperty;
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
    ::adjacency_list(&g,(graphs->
                        super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + ppVar3[iVar9].first);
    max = *piVar4;
    do {
      iVar10 = getRndInt(-max,max);
    } while (iVar10 == 0);
    ppVar3 = (this->allActions).
             super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_118.agentA = ppVar3[iVar8].first;
    local_118.agentB = ppVar3[iVar9].first;
    local_118.actionA.m_eproperty = ppVar3[iVar8].second.m_eproperty;
    uVar7 = ppVar3[iVar8].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    uVar5 = ppVar3[iVar8].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    local_80 = (undefined4)uVar7;
    uStack_7c = (undefined4)((ulong)uVar7 >> 0x20);
    uStack_78 = (undefined4)uVar5;
    uStack_74 = (undefined4)(uVar5 >> 0x20);
    local_118.actionB.m_eproperty = ppVar3[iVar9].second.m_eproperty;
    uVar7 = ppVar3[iVar9].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    uVar5 = ppVar3[iVar9].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    local_9c = (undefined4)uVar7;
    uStack_98 = (undefined4)((ulong)uVar7 >> 0x20);
    uStack_94 = (undefined4)uVar5;
    uStack_90 = (undefined4)(uVar5 >> 0x20);
    local_118._4_4_ = iStack_84;
    local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ = local_80;
    local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ = uStack_7c
    ;
    local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ = uStack_78
    ;
    local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ = local_9c;
    local_118._36_4_ = uStack_a0;
    local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ = uStack_98
    ;
    local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ = uStack_94
    ;
    local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ = uStack_74
    ;
    local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ = uStack_90
    ;
    local_118.cost = iVar10;
    this_01 = std::
              map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>
              ::operator[]((this->interactionMaps).
                           super__Vector_base<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>,_std::allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + local_118.agentA,
                           &local_118.actionA);
    std::
    vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>::
    push_back(this_01,&local_118);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
    ::~adjacency_list(&g);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&generated._M_t);
  return;
}

Assistant:

Scenario::Scenario(const std::vector<std::vector<Edge> >& actions, 
									 const std::vector<Graph>& graphs, int numInteractions) : 
		interactionMaps(actions.size()), allActions() {

	for (int i = 0; i < actions.size(); ++i) {
		transform(actions[i].begin(), actions[i].end(), 
							back_inserter(allActions), 
							[i](const Edge& e){return make_pair(i, e);});
	}

	set<pair<int, int> > generated;

	for (int i = 0; i < numInteractions; ++i) {

		int actA, actB;
		
		do {
			actA = getRndInt(allActions.size()-1);
			actB = getRndInt(allActions.size()-1);
		} while ((allActions[actA].first == allActions[actB].first) || 
					  (generated.find(make_pair(actA, actB)) != generated.end()));

		generated.insert(make_pair(actA, actB));
 
 		std::pair<int, Edge> action = allActions[actB];

 		Graph g = graphs[action.first];
 		int cost = g[action.second].cost;

 		int interactionCost;
 		do {
 			interactionCost = getRndInt(-cost, cost);
 		} while (interactionCost == 0);

		Interaction interaction(allActions[actA], allActions[actB], interactionCost);
		insertInteraction(interaction);
	}

}